

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O3

string * __thiscall
chaiscript::exception::eval_error::format_parameters_abi_cxx11_
          (string *__return_storage_ptr__,eval_error *this,
          vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *t_parameters,
          bool t_dot_notation,Dispatch_Engine *t_ss)

{
  undefined7 in_register_00000009;
  const_iterator itr;
  long *plVar1;
  char *__s;
  string paramstr;
  stringstream ss;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"(",1);
  plVar1 = *(long **)this;
  if (plVar1 != *(long **)&this->field_0x8) {
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    local_1e0._M_string_length = 0;
    local_1e0.field_2._M_local_buf[0] = '\0';
    local_1c0 = __return_storage_ptr__;
    do {
      __s = "";
      if ((*(byte *)(*plVar1 + 0x10) & 1) != 0) {
        __s = "const ";
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_1e0,__s);
      detail::Dispatch_Engine::get_type_name_abi_cxx11_
                (&local_200,(Dispatch_Engine *)CONCAT71(in_register_00000009,t_dot_notation),
                 (Type_Info *)*plVar1);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&local_1e0,local_200._M_dataplus._M_p,local_200._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
      }
      if (plVar1 == *(long **)this && (char)t_parameters == '\x01') {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&local_1e0,").(");
        if (*(long *)&this->field_0x8 - *(long *)this == 0x10) goto LAB_0032cba0;
      }
      else {
LAB_0032cba0:
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&local_1e0,", ");
      }
      plVar1 = plVar1 + 2;
    } while (plVar1 != *(long **)&this->field_0x8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_200,&local_1e0,0,local_1e0._M_string_length - 2);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_200._M_dataplus._M_p,local_200._M_string_length);
    __return_storage_ptr__ = local_1c0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,
                      CONCAT71(local_1e0.field_2._M_allocated_capacity._1_7_,
                               local_1e0.field_2._M_local_buf[0]) + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,")",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

static std::string
      format_parameters(const std::vector<Boxed_Value> &t_parameters, bool t_dot_notation, const chaiscript::detail::Dispatch_Engine &t_ss) {
        std::stringstream ss;
        ss << "(";

        if (!t_parameters.empty()) {
          std::string paramstr;

          for (auto itr = t_parameters.begin(); itr != t_parameters.end(); ++itr) {
            paramstr += (itr->is_const() ? "const " : "");
            paramstr += t_ss.type_name(*itr);

            if (itr == t_parameters.begin() && t_dot_notation) {
              paramstr += ").(";
              if (t_parameters.size() == 1) {
                paramstr += ", ";
              }
            } else {
              paramstr += ", ";
            }
          }

          ss << paramstr.substr(0, paramstr.size() - 2);
        }
        ss << ")";

        return ss.str();
      }